

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::GtMatcher<int>,int>::CheckElem<int,int>
          (PairMatcher<iutest::detail::GtMatcher<int>,int> *this,int *actual,int *matcher)

{
  AssertionResult local_48;
  EqMatcher<int> local_20;
  
  local_20.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_0023f1d0;
  local_20.m_expected = matcher;
  EqMatcher<int>::operator()(&local_48,&local_20,actual);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  return local_48.m_result;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }